

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

int __thiscall amrex::AmrLevel::derive(AmrLevel *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  undefined4 uVar1;
  bool bVar2;
  int extraout_EAX;
  int iVar3;
  int extraout_EAX_00;
  StateData *pSVar4;
  DeriveBoxMap p_Var5;
  FabArrayBase *this_00;
  char *pcVar6;
  Box *pBVar7;
  BaseFab<double> *pBVar8;
  MFInfo *pMVar9;
  FabArrayBase *pFVar10;
  int *piVar11;
  DeriveFunc p_Var12;
  DeriveFunc3D p_Var13;
  int __c;
  int *__s;
  string msg;
  int *bc3D;
  Real dt;
  Real *xlo;
  RealBox *temp;
  int *bcr;
  Real *dx;
  int *dom_hi;
  int *dom_lo;
  int n_state;
  int *chi;
  int *clo;
  Real *cdat;
  int n_der;
  int *hi;
  int *lo;
  Box *gtbx;
  int *dhi;
  int *dlo;
  Real *ddat;
  int idx;
  MFIter mfi_1;
  int dncomp;
  FArrayBox *datafab;
  FArrayBox *derfab;
  Box *bx;
  MFIter mfi;
  int dc;
  int k;
  MultiFab srcMF;
  int g;
  Box bx1;
  Box bx0;
  int ngrow_src;
  BoxArray *srcBA;
  DeriveRec *rec;
  int ncomp;
  int scomp;
  int index;
  int ngrow;
  size_type in_stack_fffffffffffff948;
  Amr *in_stack_fffffffffffff950;
  int *in_stack_fffffffffffff958;
  BoxArray *in_stack_fffffffffffff960;
  BaseFab<double> *in_stack_fffffffffffff968;
  MFInfo *in_stack_fffffffffffff970;
  FabArrayBase *in_stack_fffffffffffff978;
  MFIter *in_stack_fffffffffffff980;
  BoxArray *in_stack_fffffffffffff988;
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  *in_stack_fffffffffffff990;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff9a0;
  Geometry *in_stack_fffffffffffff9b0;
  FabArrayBase *in_stack_fffffffffffff9b8;
  MFIter *in_stack_fffffffffffff9c0;
  allocator local_4e1;
  string local_4e0 [32];
  int *local_4c0;
  Real local_4b8;
  MFIter *local_4b0;
  int in_stack_fffffffffffffb7c;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  Real in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  MultiFab *in_stack_fffffffffffffb98;
  AmrLevel *in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffbb0;
  undefined1 local_44c [20];
  double *local_438;
  undefined1 local_42c [24];
  Box local_414;
  Box *local_3f8;
  int *local_3f0;
  int *local_3e8;
  double *local_3e0;
  int local_3d4;
  MFIter local_3d0;
  undefined4 local_34c;
  FArrayBox *local_348;
  FArrayBox *local_340;
  undefined1 local_334 [28];
  undefined1 *local_318;
  MFIter local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  int local_c8;
  Box local_c4;
  Box local_a8;
  int local_8c;
  BoxArray *local_88;
  DeriveRec *local_80;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  undefined4 local_64;
  int *local_60;
  Real local_58;
  EVP_PKEY_CTX *local_50;
  AmrLevel *local_48;
  undefined8 local_40;
  char *local_38;
  
  local_64 = SUB84(keylen,0);
  local_60 = (int *)key;
  local_50 = ctx;
  local_48 = this;
  local_68 = FabArrayBase::nGrow((FabArrayBase *)key,0);
  bVar2 = isStateVariable((string *)in_stack_fffffffffffff968,(int *)in_stack_fffffffffffff960,
                          in_stack_fffffffffffff958);
  iVar3 = (int)((ulong)in_stack_fffffffffffff958 >> 0x20);
  if (bVar2) {
    FillPatch(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
              (int)((ulong)in_stack_fffffffffffffb90 >> 0x20),in_stack_fffffffffffffb88,
              in_stack_fffffffffffffb84,in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,
              in_stack_fffffffffffffbb0);
    iVar3 = extraout_EAX;
  }
  else {
    local_80 = DeriveList::get((DeriveList *)in_stack_fffffffffffff968,
                               (string *)in_stack_fffffffffffff960);
    if (local_80 == (DeriveRec *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4e0,"AmrLevel::derive(MultiFab*): unknown variable: ",&local_4e1);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
      std::__cxx11::string::operator+=(local_4e0,(string *)local_50);
      local_40 = std::__cxx11::string::c_str();
      Error_host((char *)in_stack_fffffffffffff960);
      iVar3 = std::__cxx11::string::~string(local_4e0);
    }
    else {
      DeriveRec::getRange(local_80,0,&local_6c,&local_70,&local_74);
      pSVar4 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                         ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                          in_stack_fffffffffffff950,in_stack_fffffffffffff948);
      local_88 = StateData::boxArray(pSVar4);
      local_8c = local_68;
      BoxArray::operator[](in_stack_fffffffffffff960,iVar3);
      p_Var5 = DeriveRec::boxMap(local_80);
      (*p_Var5)(&local_c4,&local_a8);
      iVar3 = Box::smallEnd(&local_a8,0);
      local_c8 = Box::smallEnd(&local_c4,0);
      local_c8 = iVar3 - local_c8;
      local_8c = local_8c + local_c8;
      DeriveRec::numState(local_80);
      local_268 = 0;
      uStack_260 = 0;
      local_278 = 0;
      uStack_270 = 0;
      local_258 = 0;
      MFInfo::MFInfo((MFInfo *)0x139e695);
      this_00 = (FabArrayBase *)
                std::
                unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             *)in_stack_fffffffffffff950);
      MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                         (DistributionMapping *)in_stack_fffffffffffff980,
                         (int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                         (int)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                         in_stack_fffffffffffff9a0);
      MFInfo::~MFInfo((MFInfo *)0x139e704);
      local_28c._M_allocated_capacity._0_4_ = 0;
      for (local_28c._M_allocated_capacity._4_4_ = 0; uVar1 = local_28c._M_allocated_capacity._4_4_,
          iVar3 = DeriveRec::numRange(local_80), (int)uVar1 < iVar3;
          local_28c._M_allocated_capacity._4_4_ = local_28c._M_allocated_capacity._4_4_ + 1) {
        DeriveRec::getRange(local_80,local_28c._M_allocated_capacity._4_4_,&local_6c,&local_70,
                            &local_74);
        this_00 = (FabArrayBase *)
                  CONCAT44((int)((ulong)this_00 >> 0x20),local_28c._M_allocated_capacity._0_4_);
        FillPatch(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                  (int)((ulong)in_stack_fffffffffffffb90 >> 0x20),in_stack_fffffffffffffb88,
                  in_stack_fffffffffffffb84,in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,
                  in_stack_fffffffffffffbb0);
        local_28c._M_allocated_capacity._0_4_ = local_74 + local_28c._M_allocated_capacity._0_4_;
      }
      DeriveRec::derFuncFab((DeriveRec *)this_00);
      bVar2 = std::operator!=((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                               *)in_stack_fffffffffffff950,this_00);
      std::
      function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
      ::~function((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                   *)0x139e864);
      if (bVar2) {
        TilingIfNotGPU();
        MFIter::MFIter(in_stack_fffffffffffff980,in_stack_fffffffffffff978,
                       SUB81((ulong)in_stack_fffffffffffff970 >> 0x38,0));
        while (bVar2 = MFIter::isValid(&local_310), bVar2) {
          MFIter::growntilebox
                    (in_stack_fffffffffffff9c0,(int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
          local_318 = local_334;
          local_340 = FabArray<amrex::FArrayBox>::operator[]
                                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff950,
                                 (MFIter *)this_00);
          local_348 = FabArray<amrex::FArrayBox>::operator[]
                                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff950,
                                 (MFIter *)this_00);
          local_34c = DeriveRec::numDerive(local_80);
          DeriveRec::derFuncFab((DeriveRec *)this_00);
          this_00 = (FabArrayBase *)&this->geom;
          in_stack_fffffffffffff950 = (Amr *)DeriveRec::getBC(local_80);
          std::
          function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
          ::operator()(in_stack_fffffffffffff990,(Box *)in_stack_fffffffffffff988,
                       (FArrayBox *)in_stack_fffffffffffff980,
                       (int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                       (int)in_stack_fffffffffffff978,(FArrayBox *)in_stack_fffffffffffff970,
                       in_stack_fffffffffffff9b0,(double)in_stack_fffffffffffff968,
                       (int *)in_stack_fffffffffffff9b8,(int)in_stack_fffffffffffff9c0);
          std::
          function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
          ::~function((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                       *)0x139ea5b);
          MFIter::operator++(&local_310);
        }
        MFIter::~MFIter((MFIter *)in_stack_fffffffffffff950);
      }
      else {
        __s = local_60;
        MFIter::MFIter(in_stack_fffffffffffff980,in_stack_fffffffffffff978,
                       SUB81((ulong)in_stack_fffffffffffff970 >> 0x38,0));
        while (bVar2 = MFIter::isValid(&local_3d0), bVar2) {
          pcVar6 = MFIter::index(&local_3d0,(char *)__s,__c);
          local_3d4 = (int)pcVar6;
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff950,(MFIter *)this_00);
          local_3e0 = BaseFab<double>::dataPtr
                                (in_stack_fffffffffffff968,
                                 (int)((ulong)in_stack_fffffffffffff960 >> 0x20));
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff950,(MFIter *)this_00);
          local_3e8 = BaseFab<double>::loVect((BaseFab<double> *)0x139eb43);
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff950,(MFIter *)this_00);
          local_3f0 = BaseFab<double>::hiVect((BaseFab<double> *)0x139eb68);
          MFIter::growntilebox
                    (in_stack_fffffffffffff9c0,(int)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
          local_3f8 = &local_414;
          local_42c._12_8_ = Box::loVect(local_3f8);
          local_42c._4_8_ = Box::hiVect(local_3f8);
          local_42c._0_4_ = DeriveRec::numDerive(local_80);
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff950,(MFIter *)this_00);
          local_438 = BaseFab<double>::dataPtr
                                (in_stack_fffffffffffff968,
                                 (int)((ulong)in_stack_fffffffffffff960 >> 0x20));
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff950,(MFIter *)this_00);
          local_44c._12_8_ = BaseFab<double>::loVect((BaseFab<double> *)0x139ec1c);
          FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff950,(MFIter *)this_00);
          local_44c._4_8_ = BaseFab<double>::hiVect((BaseFab<double> *)0x139ec41);
          local_44c._0_4_ = DeriveRec::numState(local_80);
          pSVar4 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                             ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                              in_stack_fffffffffffff950,(size_type)this_00);
          pBVar7 = StateData::getDomain(pSVar4);
          pBVar8 = (BaseFab<double> *)Box::loVect(pBVar7);
          pSVar4 = Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                             ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                              in_stack_fffffffffffff950,(size_type)this_00);
          pBVar7 = StateData::getDomain(pSVar4);
          pMVar9 = (MFInfo *)Box::hiVect(pBVar7);
          pFVar10 = (FabArrayBase *)CoordSys::CellSize(&(this->geom).super_CoordSys);
          piVar11 = DeriveRec::getBC(local_80);
          CoordSys::CellSize(&(this->geom).super_CoordSys);
          Geometry::ProbLo((Geometry *)0x139ed2d);
          RealBox::RealBox((RealBox *)in_stack_fffffffffffff980,(Box *)in_stack_fffffffffffff978,
                           (Real *)in_stack_fffffffffffff970,(Real *)in_stack_fffffffffffff968);
          local_4b0 = (MFIter *)RealBox::lo((RealBox *)&stack0xfffffffffffffb58);
          __s = (int *)(ulong)(uint)this->level;
          local_4b8 = Amr::dtLevel(in_stack_fffffffffffff950,(int)((ulong)this_00 >> 0x20));
          p_Var12 = DeriveRec::derFunc(local_80);
          if (p_Var12 == (DeriveFunc)0x0) {
            p_Var13 = DeriveRec::derFunc3D(local_80);
            if (p_Var13 == (DeriveFunc3D)0x0) {
              local_38 = "AmrLevel::derive: no function available";
              Error_host((char *)in_stack_fffffffffffff960);
            }
            else {
              local_4c0 = DeriveRec::getBC3D(local_80);
              in_stack_fffffffffffff978 = pFVar10;
              in_stack_fffffffffffff970 = pMVar9;
              p_Var13 = DeriveRec::derFunc3D(local_80);
              in_stack_fffffffffffff950 = (Amr *)local_44c;
              __s = local_3e8;
              this_00 = (FabArrayBase *)local_44c._4_8_;
              in_stack_fffffffffffff960 = (BoxArray *)local_42c._4_8_;
              in_stack_fffffffffffff980 = local_4b0;
              (*p_Var13)(local_3e0,local_3e8,local_3f0,(int *)local_42c,local_438,
                         (int *)local_44c._12_8_,(int *)local_44c._4_8_,
                         (int *)in_stack_fffffffffffff950,(int *)local_42c._12_8_,
                         (int *)local_42c._4_8_,(int *)pBVar8,(int *)in_stack_fffffffffffff970,
                         (Real *)in_stack_fffffffffffff978,(Real *)local_4b0,&local_58,&local_4b8,
                         local_4c0,&this->level,&local_3d4);
              in_stack_fffffffffffff968 = pBVar8;
            }
          }
          else {
            in_stack_fffffffffffff9b8 = pFVar10;
            p_Var12 = DeriveRec::derFunc(local_80);
            this_00 = (FabArrayBase *)(local_3f0 + 2);
            in_stack_fffffffffffff968 =
                 (BaseFab<double> *)&((BATransformer *)local_44c._12_8_)->m_op;
            in_stack_fffffffffffff970 =
                 (MFInfo *)&(((BATransformer *)local_44c._12_8_)->m_op).m_bndryReg.m_typ;
            in_stack_fffffffffffff980 = (MFIter *)&((CoordSys *)local_44c._4_8_)->field_0x4;
            in_stack_fffffffffffff950 = (Amr *)local_42c;
            __s = local_3e8;
            in_stack_fffffffffffff960 = (BoxArray *)local_44c._12_8_;
            in_stack_fffffffffffff978 = (FabArrayBase *)local_44c._4_8_;
            in_stack_fffffffffffff9c0 = local_4b0;
            (*p_Var12)(local_3e0,local_3e8,local_3e8 + 1,local_3e8 + 2,local_3f0,local_3f0 + 1,
                       (int *)this_00,(int *)in_stack_fffffffffffff950,local_438,
                       (int *)local_44c._12_8_,(int *)in_stack_fffffffffffff968,
                       (int *)in_stack_fffffffffffff970,(int *)local_44c._4_8_,
                       (int *)in_stack_fffffffffffff980,(int *)(local_44c._4_8_ + 8),
                       (int *)local_44c,(int *)local_42c._12_8_,(int *)local_42c._4_8_,(int *)pBVar8
                       ,(int *)pMVar9,(Real *)in_stack_fffffffffffff9b8,(Real *)local_4b0,&local_58,
                       &local_4b8,piVar11,&this->level,&local_3d4);
          }
          MFIter::operator++(&local_3d0);
        }
        MFIter::~MFIter((MFIter *)in_stack_fffffffffffff950);
      }
      MultiFab::~MultiFab((MultiFab *)0x139f14f);
      iVar3 = extraout_EAX_00;
    }
  }
  return iVar3;
}

Assistant:

void
AmrLevel::derive (const std::string& name, Real time, MultiFab& mf, int dcomp)
{
    BL_ASSERT(dcomp < mf.nComp());

    const int ngrow = mf.nGrow();

    int index, scomp, ncomp;

    if (isStateVariable(name,index,scomp))
    {
        FillPatch(*this,mf,ngrow,time,index,scomp,1,dcomp);
    }
    else if (const DeriveRec* rec = derive_lst.get(name))
    {
        rec->getRange(0,index,scomp,ncomp);

        const BoxArray& srcBA = state[index].boxArray();

        int ngrow_src = ngrow;
        {
            Box bx0 = srcBA[0];
            Box bx1 = rec->boxMap()(bx0);
            int g = bx0.smallEnd(0) - bx1.smallEnd(0);
            ngrow_src += g;
        }

        MultiFab srcMF(srcBA,dmap,rec->numState(),ngrow_src, MFInfo(), *m_factory);

        for (int k = 0, dc = 0; k < rec->numRange(); k++, dc += ncomp)
        {
            rec->getRange(k,index,scomp,ncomp);

            FillPatch(*this,srcMF,ngrow_src,time,index,scomp,ncomp,dc);
        }

        if (rec->derFuncFab() != nullptr)
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox();
                FArrayBox& derfab = mf[mfi];
                FArrayBox const& datafab = srcMF[mfi];
                const int dncomp = rec->numDerive();
                rec->derFuncFab()(bx, derfab, dcomp, dncomp, datafab, geom, time, rec->getBC(), level);
            }
        }
        else
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(mf,true); mfi.isValid(); ++mfi)
        {
            int         idx     = mfi.index();
            Real*       ddat    = mf[mfi].dataPtr(dcomp);
            const int*  dlo     = mf[mfi].loVect();
            const int*  dhi     = mf[mfi].hiVect();
            const Box&  gtbx    = mfi.growntilebox();
            const int*  lo      = gtbx.loVect();
            const int*  hi      = gtbx.hiVect();
            int         n_der   = rec->numDerive();
            Real*       cdat    = srcMF[mfi].dataPtr();
            const int*  clo     = srcMF[mfi].loVect();
            const int*  chi     = srcMF[mfi].hiVect();
            int         n_state = rec->numState();
            const int*  dom_lo  = state[index].getDomain().loVect();
            const int*  dom_hi  = state[index].getDomain().hiVect();
            const Real* dx      = geom.CellSize();
            const int*  bcr     = rec->getBC();
            const RealBox& temp = RealBox(gtbx,geom.CellSize(),geom.ProbLo());
            const Real* xlo     = temp.lo();
            Real        dt      = parent->dtLevel(level);

            if (rec->derFunc() != static_cast<DeriveFunc>(0)){
               rec->derFunc()(ddat,AMREX_ARLIM(dlo),AMREX_ARLIM(dhi),&n_der,
                              cdat,AMREX_ARLIM(clo),AMREX_ARLIM(chi),&n_state,
                              lo,hi,dom_lo,dom_hi,dx,xlo,&time,&dt,bcr,
                              &level,&idx);
            } else if (rec->derFunc3D() != static_cast<DeriveFunc3D>(0)){
               const int *bc3D = rec->getBC3D();
               rec->derFunc3D()(ddat,AMREX_ARLIM_3D(dlo),AMREX_ARLIM_3D(dhi),&n_der,
                                cdat,AMREX_ARLIM_3D(clo),AMREX_ARLIM_3D(chi),&n_state,
                                AMREX_ARLIM_3D(lo),AMREX_ARLIM_3D(hi),
                                AMREX_ARLIM_3D(dom_lo),AMREX_ARLIM_3D(dom_hi),
                                AMREX_ZFILL(dx),AMREX_ZFILL(xlo),
                                &time,&dt,
                                bc3D,
                                &level,&idx);
            } else {
               amrex::Error("AmrLevel::derive: no function available");
            }
        }
        }
    }
    else
    {
        //
        // If we got here, cannot derive given name.
        //
        std::string msg("AmrLevel::derive(MultiFab*): unknown variable: ");
        msg += name;
        amrex::Error(msg.c_str());
    }
}